

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

bool __thiscall flatbuffers::cpp::CppGenerator::TypeHasKey(CppGenerator *this,Type *type)

{
  bool bVar1;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *this_00;
  reference ppFVar2;
  FieldDef **field;
  iterator __end2;
  iterator __begin2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  Type *type_local;
  CppGenerator *this_local;
  
  if (type->base_type == BASE_TYPE_STRUCT) {
    this_00 = &(type->struct_def->fields).vec;
    __end2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (this_00);
    field = (FieldDef **)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                       *)&field), bVar1) {
      ppFVar2 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&__end2);
      if (((*ppFVar2)->key & 1U) != 0) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&__end2);
    }
  }
  return false;
}

Assistant:

bool TypeHasKey(const Type &type) {
    if (type.base_type != BASE_TYPE_STRUCT) { return false; }
    for (auto &field : type.struct_def->fields.vec) {
      if (field->key) { return true; }
    }
    return false;
  }